

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::remap_shader_module_handle
          (Impl *this,VkPipelineShaderStageCreateInfo *info)

{
  VkShaderModule *out_module;
  bool bVar1;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info_00;
  int *piVar2;
  VkShaderModule pVVar3;
  WorkItem record_item;
  VkShaderModule local_48;
  uint64_t uStack_40;
  int *local_38;
  Hash HStack_30;
  
  if (this->module_identifier_database_iface != (DatabaseInterface *)0x0) {
    for (info_00 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)info->pNext;
        info_00 != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
        info_00 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)info_00->pNext) {
      if (info_00->sType ==
          VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT)
      goto LAB_0016084b;
    }
  }
  info_00 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
LAB_0016084b:
  out_module = &info->module;
  if (info->module == (VkShaderModule)0x0) {
    for (piVar2 = (int *)info->pNext; piVar2 != (int *)0x0; piVar2 = *(int **)(piVar2 + 2)) {
      if (*piVar2 == 0x10) goto LAB_00160890;
    }
    piVar2 = (int *)0x0;
LAB_00160890:
    if (piVar2 == (int *)0x0) {
      if (info_00 != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
        local_48 = (VkShaderModule)0x0;
        bVar1 = get_hash_for_shader_module(this,info_00,(Hash *)&local_48);
        if (bVar1) {
          *out_module = local_48;
          register_on_use(this,RESOURCE_SHADER_MODULE,(Hash)local_48);
          goto LAB_001608b6;
        }
      }
      return false;
    }
    HStack_30 = 0;
    local_48 = (VkShaderModule)0x0;
    uStack_40 = 0;
    local_38 = piVar2;
    pVVar3 = (VkShaderModule)record_shader_module(this,(WorkItem *)&local_48,true);
    *out_module = pVVar3;
  }
  else {
    bVar1 = remap_shader_module_handle(this,info->module,out_module);
    if (!bVar1) {
      return false;
    }
  }
LAB_001608b6:
  if (info_00 != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
    register_module_identifier(this,*out_module,info_00);
  }
  return true;
}

Assistant:

bool StateRecorder::Impl::remap_shader_module_handle(VkPipelineShaderStageCreateInfo &info)
{
	const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *identifier = nullptr;
	if (module_identifier_database_iface)
	{
		identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, info.pNext);
	}

	if (info.module != VK_NULL_HANDLE)
	{
		if (!remap_shader_module_handle(info.module, &info.module))
			return false;
	}
	else if (const auto *module = find_pnext<VkShaderModuleCreateInfo>(
			VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, info.pNext))
	{
		WorkItem record_item = {};
		record_item.create_info = const_cast<VkShaderModuleCreateInfo *>(module);
		Hash h = record_shader_module(record_item, true);
		info.module = api_object_cast<VkShaderModule>(h);
	}
	else if (identifier)
	{
		Hash h = 0;
		if (!get_hash_for_shader_module(identifier, &h))
			return false;
		info.module = api_object_cast<VkShaderModule>(h);
		register_on_use(RESOURCE_SHADER_MODULE, h);
	}
	else
		return false;

	if (identifier)
		register_module_identifier(info.module, *identifier);

	return true;
}